

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  uVar11 = *(uint *)this;
  pcVar1 = *it + *(uint *)(this + 4);
  pcVar2 = pcVar1;
  if (uVar11 < 100) {
    bVar12 = false;
  }
  else {
    iVar5 = -1;
    uVar6 = 1;
    iVar7 = -2;
    uVar8 = 2;
    do {
      uVar4 = uVar11;
      uVar9 = (ulong)((uVar4 % 100) * 2);
      pcVar2[-1] = internal::basic_data<void>::DIGITS[uVar9 + 1];
      lVar10 = -1;
      if ((uVar6 / 3) * 3 + iVar5 == 0) {
        *(num_writer *)(pcVar2 + -2) = this[8];
        lVar10 = -2;
      }
      pcVar2[lVar10 + -1] = internal::basic_data<void>::DIGITS[uVar9];
      if ((int)(uVar8 / 3) * 3 + iVar7 == 0) {
        *(num_writer *)(pcVar2 + lVar10 + -2) = this[8];
        lVar10 = lVar10 + -2;
      }
      else {
        lVar10 = lVar10 + -1;
      }
      pcVar2 = pcVar2 + lVar10;
      iVar5 = iVar5 + -2;
      uVar6 = uVar6 + 2;
      iVar7 = iVar7 + -2;
      uVar8 = (ulong)((int)uVar8 + 2);
      uVar11 = uVar4 / 100;
    } while (9999 < uVar4);
    bVar12 = iVar5 + (uVar6 / 3) * 3 == 0;
    uVar11 = uVar4 / 100;
  }
  if (uVar11 < 10) {
    bVar3 = (byte)uVar11 | 0x30;
  }
  else {
    pcVar2[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1];
    lVar10 = -1;
    if (bVar12) {
      *(num_writer *)(pcVar2 + -2) = this[8];
      lVar10 = -2;
    }
    pcVar2 = pcVar2 + lVar10;
    bVar3 = internal::basic_data<void>::DIGITS[(ulong)uVar11 * 2];
  }
  pcVar2[-1] = bVar3;
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }